

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O2

TPM_RC TPM2_Create(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT parentHandle,
                  TPM2B_SENSITIVE_CREATE *inSensitive,TPM2B_PUBLIC *inPublic,TPM2B_DATA *outsideInfo
                  ,TPML_PCR_SELECTION *creationPCR,TPM2B_PRIVATE *outPrivate,TPM2B_PUBLIC *outPublic
                  ,TPM2B_CREATION_DATA *creationData,TPM2B_DIGEST *creationHash,
                  TPMT_TK_CREATION *creationTicket)

{
  BYTE **buffer;
  UINT32 *size;
  UINT16 UVar1;
  TPM_RC TVar2;
  TPM_RC TVar3;
  TPMI_DH_OBJECT parentHandle_local;
  TSS_SESSION *session_local;
  INT32 sizeParamBuf;
  BYTE *paramBuf;
  TPM2B_DIGEST local_318c [4];
  TSS_CMD_CONTEXT CmdCtx;
  
  sizeParamBuf = 0x1000;
  paramBuf = CmdCtx.ParamBuffer;
  CmdCtx.ParamSize = 0;
  parentHandle_local = parentHandle;
  session_local = session;
  UVar1 = TPM2B_SENSITIVE_CREATE_Marshal(inSensitive,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
  UVar1 = TPM2B_PUBLIC_Marshal(inPublic,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
  UVar1 = TPM2B_DATA_Marshal(outsideInfo,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
  UVar1 = TPML_PCR_SELECTION_Marshal(creationPCR,&paramBuf,&sizeParamBuf);
  CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
  TVar2 = TSS_DispatchCmd(tpm,0x153,&parentHandle_local,1,&session_local,1,&CmdCtx);
  if (TVar2 == 0) {
    buffer = &CmdCtx.RespBufPtr;
    size = &CmdCtx.RespBytesLeft;
    TVar3 = TPM2B_PRIVATE_Unmarshal(outPrivate,buffer,(INT32 *)size);
    TVar2 = 0x9a;
    if (TVar3 == 0) {
      TVar3 = TPM2B_PUBLIC_Unmarshal(outPublic,buffer,(INT32 *)size,1);
      if (TVar3 == 0) {
        if (creationData == (TPM2B_CREATION_DATA *)0x0) {
          creationData = (TPM2B_CREATION_DATA *)local_318c;
        }
        TVar3 = TPM2B_CREATION_DATA_Unmarshal(creationData,buffer,(INT32 *)size);
        if (TVar3 == 0) {
          if (creationHash == (TPM2B_DIGEST *)0x0) {
            creationHash = local_318c;
          }
          TVar3 = TPM2B_DIGEST_Unmarshal(creationHash,buffer,(INT32 *)size);
          if (TVar3 == 0) {
            if (creationTicket == (TPMT_TK_CREATION *)0x0) {
              creationTicket = (TPMT_TK_CREATION *)local_318c;
            }
            TVar3 = TPMT_TK_CREATION_Unmarshal(creationTicket,buffer,(INT32 *)size);
            if (TVar3 == 0) {
              TVar2 = 0;
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPM2_Create(
    TSS_DEVICE               *tpm,              // IN/OUT
    TSS_SESSION              *session,          // IN/OUT
    TPMI_DH_OBJECT            parentHandle,     // IN
    TPM2B_SENSITIVE_CREATE   *inSensitive,      // IN
    TPM2B_PUBLIC             *inPublic,         // IN
    TPM2B_DATA               *outsideInfo,      // IN
    TPML_PCR_SELECTION       *creationPCR,      // IN
    TPM2B_PRIVATE            *outPrivate,       // OUT
    TPM2B_PUBLIC             *outPublic,        // OUT
    TPM2B_CREATION_DATA      *creationData,     // OUT
    TPM2B_DIGEST             *creationHash,     // OUT
    TPMT_TK_CREATION         *creationTicket    // OUT
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL(TPM2B_SENSITIVE_CREATE, inSensitive);
    TSS_MARSHAL(TPM2B_PUBLIC, inPublic);
    TSS_MARSHAL(TPM2B_DATA, outsideInfo);
    TSS_MARSHAL(TPML_PCR_SELECTION, creationPCR);
    DISPATCH_CMD(Create, &parentHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_PRIVATE, outPrivate);
    TSS_UNMARSHAL_FLAGGED(TPM2B_PUBLIC, outPublic);
    TSS_UNMARSHAL_OPT(TPM2B_CREATION_DATA, creationData);
    TSS_UNMARSHAL_OPT(TPM2B_DIGEST, creationHash);
    TSS_UNMARSHAL_OPT(TPMT_TK_CREATION, creationTicket);
    END_CMD();
}